

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defaults.c
# Opt level: O2

void link_stream(st_quicly_default_scheduler_state_t *sched,quicly_stream_t *stream,
                int conn_is_blocked)

{
  quicly_linklist_t *n;
  int iVar1;
  
  n = &(stream->_send_aux).pending_link.default_scheduler;
  if ((stream->_send_aux).pending_link.default_scheduler.prev != n) {
    return;
  }
  if (conn_is_blocked != 0) {
    iVar1 = quicly_stream_can_send(stream,0);
    sched = (st_quicly_default_scheduler_state_t *)(&sched->active + (iVar1 == 0));
  }
  quicly_linklist_insert((sched->active).prev,n);
  return;
}

Assistant:

static void link_stream(struct st_quicly_default_scheduler_state_t *sched, quicly_stream_t *stream, int conn_is_blocked)
{
    if (!quicly_linklist_is_linked(&stream->_send_aux.pending_link.default_scheduler)) {
        quicly_linklist_t *slot = &sched->active;
        if (conn_is_blocked && !quicly_stream_can_send(stream, 0))
            slot = &sched->blocked;
        quicly_linklist_insert(slot->prev, &stream->_send_aux.pending_link.default_scheduler);
    }
}